

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

TextureFormat sglr::toTextureFormat(PixelFormat *pixelFmt)

{
  bool bVar1;
  int iVar2;
  TestError *this;
  int local_28;
  int ndx;
  PixelFormat *pixelFmt_local;
  
  if (toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap == '\0') {
    iVar2 = __cxa_guard_acquire(&toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap);
    if (iVar2 != 0) {
      tcu::PixelFormat::PixelFormat(&toTextureFormat::pixelFormatMap[0].pixelFmt,8,8,8,8);
      tcu::TextureFormat::TextureFormat(&toTextureFormat::pixelFormatMap[0].texFmt,RGBA,UNORM_INT8);
      tcu::PixelFormat::PixelFormat(&toTextureFormat::pixelFormatMap[1].pixelFmt,8,8,8,0);
      tcu::TextureFormat::TextureFormat(&toTextureFormat::pixelFormatMap[1].texFmt,RGB,UNORM_INT8);
      tcu::PixelFormat::PixelFormat(&toTextureFormat::pixelFormatMap[2].pixelFmt,4,4,4,4);
      tcu::TextureFormat::TextureFormat
                (&toTextureFormat::pixelFormatMap[2].texFmt,RGBA,UNORM_SHORT_4444);
      tcu::PixelFormat::PixelFormat(&toTextureFormat::pixelFormatMap[3].pixelFmt,5,5,5,1);
      tcu::TextureFormat::TextureFormat
                (&toTextureFormat::pixelFormatMap[3].texFmt,RGBA,UNORM_SHORT_5551);
      tcu::PixelFormat::PixelFormat(&toTextureFormat::pixelFormatMap[4].pixelFmt,5,6,5,0);
      tcu::TextureFormat::TextureFormat
                (&toTextureFormat::pixelFormatMap[4].texFmt,RGB,UNORM_SHORT_565);
      __cxa_guard_release(&toTextureFormat(tcu::PixelFormat_const&)::pixelFormatMap);
    }
  }
  local_28 = 0;
  while( true ) {
    if (4 < local_28) {
      this = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this,"Can\'t map pixel format to texture format",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/simplereference/sglrReferenceContext.cpp"
                 ,0xb3);
      __cxa_throw(this,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    bVar1 = tcu::PixelFormat::operator==
                      (&toTextureFormat::pixelFormatMap[local_28].pixelFmt,pixelFmt);
    if (bVar1) break;
    local_28 = local_28 + 1;
  }
  return toTextureFormat::pixelFormatMap[local_28].texFmt;
}

Assistant:

tcu::TextureFormat toTextureFormat (const tcu::PixelFormat& pixelFmt)
{
	static const struct
	{
		tcu::PixelFormat	pixelFmt;
		tcu::TextureFormat	texFmt;
	} pixelFormatMap[] =
	{
		{ tcu::PixelFormat(8,8,8,8),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(8,8,8,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_INT8)			},
		{ tcu::PixelFormat(4,4,4,4),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_4444)	},
		{ tcu::PixelFormat(5,5,5,1),	tcu::TextureFormat(tcu::TextureFormat::RGBA,	tcu::TextureFormat::UNORM_SHORT_5551)	},
		{ tcu::PixelFormat(5,6,5,0),	tcu::TextureFormat(tcu::TextureFormat::RGB,		tcu::TextureFormat::UNORM_SHORT_565)	}
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pixelFormatMap); ndx++)
	{
		if (pixelFormatMap[ndx].pixelFmt == pixelFmt)
			return pixelFormatMap[ndx].texFmt;
	}

	TCU_FAIL("Can't map pixel format to texture format");
}